

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zesSchedulerGetCurrentMode(zes_sched_handle_t hScheduler,zes_sched_mode_t *pMode)

{
  zes_pfnSchedulerGetCurrentMode_t pfnGetCurrentMode;
  dditable_t *dditable;
  ze_result_t result;
  zes_sched_mode_t *pMode_local;
  zes_sched_handle_t hScheduler_local;
  
  if (*(code **)(*(long *)(hScheduler + 8) + 0xa48) == (code *)0x0) {
    hScheduler_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hScheduler_local._4_4_ =
         (**(code **)(*(long *)(hScheduler + 8) + 0xa48))(*(undefined8 *)hScheduler,pMode);
  }
  return hScheduler_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesSchedulerGetCurrentMode(
        zes_sched_handle_t hScheduler,                  ///< [in] Sysman handle for the component.
        zes_sched_mode_t* pMode                         ///< [in,out] Will contain the current scheduler mode.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_sched_object_t*>( hScheduler )->dditable;
        auto pfnGetCurrentMode = dditable->zes.Scheduler.pfnGetCurrentMode;
        if( nullptr == pfnGetCurrentMode )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hScheduler = reinterpret_cast<zes_sched_object_t*>( hScheduler )->handle;

        // forward to device-driver
        result = pfnGetCurrentMode( hScheduler, pMode );

        return result;
    }